

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall lattice::graph::print(graph *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  void *pvVar4;
  graph *pgVar5;
  ostream *in_RSI;
  graph *in_RDI;
  size_t k_1;
  size_t k;
  size_t s;
  DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *in_stack_000001d8;
  ostream *in_stack_000001e0;
  ostream *in_stack_ffffffffffffff78;
  graph *in_stack_ffffffffffffff80;
  graph *local_30;
  ulong local_28;
  ulong local_18;
  
  poVar2 = std::operator<<(in_RSI,"dimension: ");
  sVar3 = dimension(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"number of sites: ");
  sVar3 = num_sites((graph *)0x10275b);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"number of bonds: ");
  sVar3 = num_bonds((graph *)0x102795);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_18 = 0;
  while( true ) {
    sVar3 = num_sites((graph *)0x1027ce);
    if (sVar3 <= local_18) break;
    poVar2 = std::operator<<(in_RSI,"site: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2," type: ");
    iVar1 = site_type(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,' ');
    std::operator<<(poVar2,"( ");
    coordinate(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff78);
    poVar2 = Eigen::operator<<(in_stack_000001e0,in_stack_000001d8);
    std::operator<<(poVar2," ) neighbors[ ");
    local_28 = 0;
    while( true ) {
      sVar3 = num_neighbors(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      if (sVar3 <= local_28) break;
      sVar3 = neighbor(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,0x1028d4);
      poVar2 = (ostream *)std::ostream::operator<<(in_RSI,sVar3);
      std::operator<<(poVar2,' ');
      local_28 = local_28 + 1;
    }
    std::operator<<(in_RSI,"] neighbor_bonds[ ");
    local_30 = (graph *)0x0;
    while( true ) {
      in_stack_ffffffffffffff80 = local_30;
      pgVar5 = (graph *)num_neighbors(local_30,(size_t)in_stack_ffffffffffffff78);
      if (pgVar5 <= in_stack_ffffffffffffff80) break;
      in_stack_ffffffffffffff78 = in_RSI;
      sVar3 = neighbor_bond(in_stack_ffffffffffffff80,(size_t)in_RSI,0x10295b);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff78,sVar3);
      std::operator<<(poVar2,' ');
      local_30 = (graph *)((long)&local_30->dim_ + 1);
    }
    std::operator<<(in_RSI,"]\n");
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void print(std::ostream& os = std::cout) const {
    os << "dimension: " << dimension() << std::endl
       << "number of sites: " << num_sites() << std::endl
       << "number of bonds: " << num_bonds() << std::endl;
    for (std::size_t s = 0; s < num_sites(); ++s) {
      os << "site: " << s << " type: " << site_type(s) << ' '
         << "( " << coordinate(s).transpose() << " ) neighbors[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor(s, k) << ' ';
      os << "] neighbor_bonds[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor_bond(s, k) << ' ';
      os << "]\n";
    }
  }